

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandListAppendMemoryCopyPrologue
          (ZEParameterValidation *this,ze_command_list_handle_t hCommandList,void *dstptr,
          void *srcptr,size_t size,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ze_event_handle_t hSignalEvent_local;
  size_t size_local;
  void *srcptr_local;
  void *dstptr_local;
  ze_command_list_handle_t hCommandList_local;
  ZEParameterValidation *this_local;
  
  if (hCommandList == (ze_command_list_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (dstptr == (void *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (srcptr == (void *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if ((phWaitEvents == (ze_event_handle_t *)0x0) && (numWaitEvents != 0)) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_SIZE;
  }
  else {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandListAppendMemoryCopyPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* dstptr,                                   ///< [in] pointer to destination memory to copy to
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        size_t size,                                    ///< [in] size in bytes to copy
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        if( nullptr == hCommandList )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == dstptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == srcptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( (nullptr == phWaitEvents) && (0 < numWaitEvents) )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ZE_RESULT_SUCCESS;
    }